

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

Function * __thiscall
spvtools::opt::InstrumentPass::GetFunction
          (InstrumentPass *this,Type *return_val,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *args)

{
  int iVar1;
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar3;
  Type *type;
  Function func;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *args_local;
  Type *return_val_local;
  InstrumentPass *this_local;
  
  func.param_types_.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)args;
  analysis::Function::Function((Function *)&type,return_val,args);
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(this_00);
  pTVar2 = analysis::TypeManager::GetRegisteredType(this_01,(Type *)&type);
  bVar3 = false;
  if (pTVar2 != (Type *)0x0) {
    iVar1 = (*pTVar2->_vptr_Type[0x21])();
    bVar3 = CONCAT44(extraout_var,iVar1) != 0;
  }
  if (!bVar3) {
    __assert_fail("type && type->AsFunction()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                  ,0x1a8,
                  "analysis::Function *spvtools::opt::InstrumentPass::GetFunction(const analysis::Type *, const std::vector<const analysis::Type *> &)"
                 );
  }
  iVar1 = (*pTVar2->_vptr_Type[0x21])();
  analysis::Function::~Function((Function *)&type);
  return (Function *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

analysis::Function* InstrumentPass::GetFunction(
    const analysis::Type* return_val,
    const std::vector<const analysis::Type*>& args) {
  analysis::Function func(return_val, args);
  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&func);
  assert(type && type->AsFunction());
  return type->AsFunction();
}